

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O2

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *classes)

{
  TreeEnsembleClassifier *pTVar1;
  StringVector *pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t i;
  ulong uVar4;
  
  pTVar1 = Specification::Model::_internal_mutable_treeensembleclassifier
                     ((this->super_TreeEnsembleBase).super_Model.m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  pSVar2 = Specification::TreeEnsembleClassifier::_internal_mutable_stringclasslabels(pTVar1);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(pSVar2->vector_).super_RepeatedPtrFieldBase);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(classes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(classes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    pTVar1 = Specification::Model::_internal_mutable_treeensembleclassifier
                       ((this->super_TreeEnsembleBase).super_Model.m_spec.
                        super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    pSVar2 = Specification::TreeEnsembleClassifier::_internal_mutable_stringclasslabels(pTVar1);
    pbVar3 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Add(&pSVar2->vector_);
    std::__cxx11::string::_M_assign((string *)pbVar3);
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<std::string>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_stringclasslabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            std::string *category = m_spec->mutable_treeensembleclassifier()->mutable_stringclasslabels()->add_vector();
            *category = classes[i];
        }
    }